

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O2

void __thiscall NetworkNS::Domain::put_in_primary_box(Domain *this,double *coords,int *pcoeffs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dStack_50;
  
  dVar1 = coords[2];
  dVar2 = this->ZBoxLen;
  dVar3 = this->BoxLow[2];
  dVar7 = *coords;
  dVar8 = coords[1];
  dVar9 = this->BoxLow[0];
  dVar10 = this->XBoxLen;
  dVar5 = this->iXBoxLen * (dVar7 - (dVar10 * 0.5 + dVar9));
  dVar6 = this->iYBoxLen * (dVar8 - (this->YBoxLen * 0.5 + this->BoxLow[1]));
  auVar4._8_4_ = SUB84(dVar6,0);
  auVar4._0_8_ = dVar5;
  auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
  dVar5 = round(dVar5);
  dStack_50 = auVar4._8_8_;
  dVar6 = round(dStack_50);
  *(ulong *)pcoeffs = CONCAT44((int)dVar6,(int)dVar5);
  dVar2 = round((dVar1 - (dVar2 * 0.5 + dVar3)) * this->iZBoxLen);
  pcoeffs[2] = (int)dVar2;
  *coords = (double)(int)dVar5 * dVar10 + dVar9 + dVar7;
  coords[1] = dVar8 + (double)(int)dVar6 * this->YBoxLen + this->BoxLow[1];
  coords[2] = (double)(int)dVar2 * this->ZBoxLen + this->BoxLow[2] + dVar1;
  return;
}

Assistant:

void Domain::put_in_primary_box(double *coords, int *pcoeffs){
      
      // Calculate the distance from the center of the simulation box.
      double distx = coords[0] - (BoxLow[0] + 0.5*XBoxLen);
      double disty = coords[1] - (BoxLow[1] + 0.5*YBoxLen);
      double distz = coords[2] - (BoxLow[2] + 0.5*ZBoxLen);
      
      // Calculate the periodic continuation coefficients:
      pcoeffs[0] = round(distx * iXBoxLen);
      pcoeffs[1] = round(disty * iYBoxLen);
      pcoeffs[2] = round(distz * iZBoxLen);
      
      coords[0] += (double)pcoeffs[0] * XBoxLen + BoxLow[0];
      coords[1] += (double)pcoeffs[1] * YBoxLen + BoxLow[1];
      coords[2] += (double)pcoeffs[2] * ZBoxLen + BoxLow[2];
      
      return;
   }